

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O1

__int_type __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
get_key_prefix_splits
          (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this)

{
  return (this->key_prefix_splits).super___atomic_base<unsigned_long>._M_i;
}

Assistant:

[[nodiscard]] auto get_key_prefix_splits() const noexcept {
    return key_prefix_splits.load(std::memory_order_relaxed);
  }